

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.c
# Opt level: O0

sexp sexp_adjust_bytecode(sexp dstp,_func_sexp_void_ptr_sexp *adjust_fn,void *adata)

{
  ulong *puVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  int iVar5;
  undefined8 in_RDX;
  code *in_RSI;
  long in_RDI;
  size_t sz_1;
  size_t sz;
  int i;
  sexp_conflict *vec;
  sexp dst;
  sexp src;
  sexp res;
  int local_3c;
  sexp local_20;
  
  local_20 = (sexp)&DAT_0000003e;
  local_3c = 0;
  do {
    if (*(ulong *)(in_RDI + 0x20) <= (ulong)(long)local_3c) {
      local_20 = (sexp)&DAT_0000013e;
      return local_20;
    }
    iVar5 = local_3c + 1;
    switch(*(undefined1 *)(in_RDI + 0x30 + (long)local_3c)) {
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xf:
    case 0x12:
    case 0x13:
    case 0x14:
      puVar1 = (ulong *)(in_RDI + 0x30 + (long)iVar5);
      uVar3 = *puVar1;
      if ((uVar3 != 0) && ((uVar3 & 3) == 0)) {
        uVar3 = (*in_RSI)(in_RDX,uVar3);
        if ((uVar3 & 3) != 0) {
          sVar4 = strlen(gc_heap_err_str);
          snprintf(gc_heap_err_str + sVar4,0x100 - sVar4," from adjust bytecode, FCALLN");
          return local_20;
        }
        *puVar1 = uVar3;
      }
    case 0xd:
    case 0xe:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x2f:
      iVar5 = local_3c + 9;
      break;
    case 0x26:
      lVar2 = in_RDI + 0x30 + (long)iVar5;
      uVar3 = *(ulong *)(lVar2 + 0x10);
      if ((uVar3 != 0) && ((uVar3 & 3) == 0)) {
        uVar3 = (*in_RSI)(in_RDX,uVar3);
        if ((uVar3 & 3) != 0) {
          sVar4 = strlen(gc_heap_err_str);
          snprintf(gc_heap_err_str + sVar4,0x100 - sVar4," from adjust bytecode, PROCEDURE");
          return local_20;
        }
        *(ulong *)(lVar2 + 0x10) = uVar3;
      }
      iVar5 = local_3c + 0x19;
      break;
    case 0x30:
    case 0x31:
    case 0x32:
      iVar5 = local_3c + 0x11;
    }
    local_3c = iVar5;
  } while( true );
}

Assistant:

static sexp sexp_adjust_bytecode(sexp dstp, sexp (*adjust_fn)(void *, sexp), void *adata) {
  sexp res = SEXP_FALSE;
  sexp   src, dst;
  sexp*  vec;
  int    i;
  
  for (i=0; i < sexp_bytecode_length(dstp); ) {
    switch (sexp_bytecode_data(dstp)[i++]) {
    case SEXP_OP_FCALL0:      case SEXP_OP_FCALL1:
    case SEXP_OP_FCALL2:      case SEXP_OP_FCALL3:
    case SEXP_OP_FCALL4:      case SEXP_OP_CALL:
    case SEXP_OP_TAIL_CALL:   case SEXP_OP_PUSH:
    case SEXP_OP_GLOBAL_REF:  case SEXP_OP_GLOBAL_KNOWN_REF:
#if SEXP_USE_GREEN_THREADS
    case SEXP_OP_PARAMETER_REF:
#endif
#if SEXP_USE_EXTENDED_FCALL
    case SEXP_OP_FCALLN:
#endif
      vec = (sexp*)(&(sexp_bytecode_data(dstp)[i]));
      src = vec[0];
      if (src && sexp_pointerp(src)) {
        dst = adjust_fn(adata, src);
        if (!sexp_pointerp(dst)) {
          size_t sz = strlen(gc_heap_err_str);
          snprintf(gc_heap_err_str + sz, ERR_STR_SIZE - sz, " from adjust bytecode, FCALLN");
          goto done; }
        vec[0] = dst;
      }
      /* ... FALLTHROUGH ... */
    case SEXP_OP_JUMP:        case SEXP_OP_JUMP_UNLESS:
    case SEXP_OP_STACK_REF:   case SEXP_OP_CLOSURE_REF:
    case SEXP_OP_LOCAL_REF:   case SEXP_OP_LOCAL_SET:
    case SEXP_OP_TYPEP:
#if SEXP_USE_RESERVE_OPCODE
    case SEXP_OP_RESERVE:
#endif
      i += sizeof(sexp); break;
    case SEXP_OP_MAKE: case SEXP_OP_SLOT_REF: case SEXP_OP_SLOT_SET:
      i += 2*sizeof(sexp); break;
    case SEXP_OP_MAKE_PROCEDURE:
      vec = (sexp*)(&(sexp_bytecode_data(dstp)[i]));
      src = vec[2];
      if (src && sexp_pointerp(src)) {
        dst = adjust_fn(adata, src);
        if (!sexp_pointerp(dst)) { 
          size_t sz = strlen(gc_heap_err_str);
          snprintf(gc_heap_err_str + sz, ERR_STR_SIZE - sz, " from adjust bytecode, PROCEDURE");
          goto done; }
        vec[2] = dst;
      }
      i += 3*sizeof(sexp); break;
    }
  }
  res = SEXP_TRUE;
done:
  return res;
}